

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

bool SQLite::Database::isUnencrypted(string *aFilename)

{
  char cVar1;
  runtime_error *prVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  Exception exception_1;
  Exception exception;
  char header [16];
  Exception EStack_268;
  Exception local_250 [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (aFilename->_M_string_length == 0) {
    Exception::Exception(local_250,"Could not open database, the aFilename parameter was empty.");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x18);
    std::runtime_error::runtime_error(prVar2,&local_250[0].super_runtime_error);
    *(undefined ***)prVar2 = &PTR__runtime_error_002a8208;
    *(undefined8 *)(prVar2 + 0x10) = local_250[0]._16_8_;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(prVar2,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::ifstream::ifstream(local_250,(aFilename->_M_dataplus)._M_p,_S_in|_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::operator+(&local_48,"Error opening file: ",aFilename);
      Exception::Exception(&EStack_268,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x18);
      std::runtime_error::runtime_error(prVar2,&EStack_268.super_runtime_error);
      *(undefined ***)prVar2 = &PTR__runtime_error_002a8208;
      *(undefined8 *)(prVar2 + 0x10) = EStack_268._16_8_;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        __cxa_throw(prVar2,&Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::istream::seekg((long)local_250,_S_beg);
      std::ios::widen((char)local_250 + (char)*(undefined8 *)(local_250[0]._0_8_ + -0x18));
      std::istream::getline((char *)local_250,(long)&local_28,'\x10');
      std::ifstream::close();
      auVar3[0] = -(local_28 == 'S');
      auVar3[1] = -(cStack_27 == 'Q');
      auVar3[2] = -(cStack_26 == 'L');
      auVar3[3] = -(cStack_25 == 'i');
      auVar3[4] = -(cStack_24 == 't');
      auVar3[5] = -(cStack_23 == 'e');
      auVar3[6] = -(cStack_22 == ' ');
      auVar3[7] = -(cStack_21 == 'f');
      auVar3[8] = -(cStack_20 == 'o');
      auVar3[9] = -(cStack_1f == 'r');
      auVar3[10] = -(cStack_1e == 'm');
      auVar3[0xb] = -(cStack_1d == 'a');
      auVar3[0xc] = -(cStack_1c == 't');
      auVar3[0xd] = -(cStack_1b == ' ');
      auVar3[0xe] = -(cStack_1a == '3');
      auVar3[0xf] = -(cStack_19 == '\0');
      std::ifstream::~ifstream(local_250);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

bool Database::isUnencrypted(const std::string& aFilename)
{
    if (aFilename.length() > 0) {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        char header[16];
        if (fileBuffer.is_open()) {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.getline(header, 16);
            fileBuffer.close();
        } else {
            const SQLite::Exception exception("Error opening file: " + aFilename);
            throw exception;
        }
        return strncmp(header, "SQLite format 3\000", 16) == 0;
    }
    const SQLite::Exception exception("Could not open database, the aFilename parameter was empty.");
    throw exception;
}